

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferredDeltaCommon
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  unsigned_long uVar1;
  pointer pBVar2;
  pointer puVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  pointer puVar6;
  Dims vMemCount;
  Dims vMemStart;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_f8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_110,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xa0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xb8));
  if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
    puVar6 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    puVar4 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar5 = puVar4 + 1;
        uVar1 = *puVar4;
        *puVar4 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + -1;
        puVar4 = puVar5;
      } while (puVar5 < puVar6);
    }
    puVar6 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    puVar4 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar5 = puVar4 + 1;
        uVar1 = *puVar4;
        *puVar4 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + -1;
        puVar4 = puVar5;
      } while (puVar5 < puVar6);
    }
    puVar6 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    puVar4 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar5 = puVar4 + 1;
        uVar1 = *puVar4;
        *puVar4 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + -1;
        puVar4 = puVar5;
      } while (puVar5 < puVar6);
    }
    puVar6 = local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    puVar4 = local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar5 = puVar4 + 1;
        uVar1 = *puVar4;
        *puVar4 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + -1;
        puVar4 = puVar5;
      } while (puVar5 < puVar6);
    }
    puVar6 = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    puVar4 = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar5 = puVar4 + 1;
        uVar1 = *puVar4;
        *puVar4 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + -1;
        puVar4 = puVar5;
      } while (puVar5 < puVar6);
    }
  }
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::emplace_back<>(&this->m_LocalReadPattern);
  pBVar2 = (this->m_LocalReadPattern).
           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)(pBVar2 + -1));
  pBVar2[-1].type = *(DataType *)(variable + 0x28);
  pBVar2[-1].elementSize = *(size_t *)(variable + 0x30);
  pBVar2[-1].shapeId = *(ShapeID *)(variable + 0x40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar2[-1].start,&local_c8)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar2[-1].count,&local_e0)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar2[-1].shape,&local_f8)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar2[-1].memStart,&local_110);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar2[-1].memCount,&local_128);
  pBVar2[-1].bufferStart = 0;
  pBVar2[-1].bufferCount = 0;
  pBVar2[-1].data = data;
  pBVar2[-1].performed = false;
  puVar6 = pBVar2[-1].count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = pBVar2[-1].count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar3) {
    do {
      if (*puVar6 == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SscReader","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"GetDeferredDeltaCommon","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"SetSelection count dimensions cannot be 0","");
        helper::Throw<std::invalid_argument>(&local_50,&local_70,&local_90,&local_b0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar3);
  }
  if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SscReaderGeneric::GetDeferredDeltaCommon(VariableBase &variable, void *data)
{

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;
    Dims vMemStart = variable.m_MemoryStart;
    Dims vMemCount = variable.m_MemoryCount;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    m_LocalReadPattern.emplace_back();
    auto &b = m_LocalReadPattern.back();
    b.name = variable.m_Name;
    b.type = variable.m_Type;
    b.elementSize = variable.m_ElementSize;
    b.shapeId = variable.m_ShapeID;
    b.start = vStart;
    b.count = vCount;
    b.shape = vShape;
    b.memStart = vMemStart;
    b.memCount = vMemCount;
    b.bufferStart = 0;
    b.bufferCount = 0;
    b.data = data;
    b.performed = false;

    for (const auto &d : b.count)
    {
        if (d == 0)
        {
            helper::Throw<std::invalid_argument>("Engine", "SscReader", "GetDeferredDeltaCommon",
                                                 "SetSelection count dimensions cannot be 0");
        }
    }
}